

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct64x64_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  longlong lVar69;
  longlong lVar70;
  longlong lVar71;
  longlong lVar72;
  longlong lVar73;
  longlong lVar74;
  longlong lVar75;
  undefined1 *puVar76;
  uint *puVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  ulong uVar81;
  long lVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  ulong uVar90;
  int iVar91;
  uint uVar92;
  uint uVar101;
  uint uVar102;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  int iVar131;
  uint uVar132;
  int iVar139;
  int iVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint uVar140;
  uint uVar142;
  int iVar143;
  uint uVar144;
  undefined1 auVar138 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  __m128i rnding;
  __m128i clamp_lo_out;
  __m128i u [64];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined8 local_5b8;
  undefined8 local_588;
  undefined8 local_578;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  uint local_438 [16];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  uint local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  uint local_348 [11];
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  uint local_248 [4];
  undefined1 local_238 [16];
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  undefined1 local_1d8 [16];
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  uint local_138 [7];
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  
  auVar121 = ZEXT416((uint)bit);
  lVar88 = (long)bit * 0x100;
  iVar78 = 1 << ((char)bit - 1U & 0x1f);
  iVar79 = bd + (uint)(do_cols == 0) * 2;
  iVar80 = 0x8000;
  if (0xf < iVar79 + 6) {
    iVar80 = 1 << ((char)iVar79 + 5U & 0x1f);
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x164);
  auVar145._4_4_ = uVar2;
  auVar145._0_4_ = uVar2;
  auVar145._8_4_ = uVar2;
  auVar145._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x168);
  auVar122._4_4_ = uVar2;
  auVar122._0_4_ = uVar2;
  auVar122._8_4_ = uVar2;
  auVar122._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x16c);
  auVar152._4_4_ = uVar2;
  auVar152._0_4_ = uVar2;
  auVar152._8_4_ = uVar2;
  auVar152._12_4_ = uVar2;
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x170);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x178);
  auVar133._4_4_ = uVar2;
  auVar133._0_4_ = uVar2;
  auVar133._8_4_ = uVar2;
  auVar133._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x25c);
  auVar161._4_4_ = uVar2;
  auVar161._0_4_ = uVar2;
  auVar161._8_4_ = uVar2;
  auVar161._12_4_ = uVar2;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar88 + 0x244);
  auVar162._4_4_ = iVar91;
  auVar162._0_4_ = iVar91;
  auVar162._8_4_ = iVar91;
  auVar162._12_4_ = iVar91;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x17c);
  auVar154._4_4_ = uVar2;
  auVar154._0_4_ = uVar2;
  auVar154._8_4_ = uVar2;
  auVar154._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x174);
  auVar159._4_4_ = uVar2;
  auVar159._0_4_ = uVar2;
  auVar159._8_4_ = uVar2;
  auVar159._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x24c);
  auVar163._4_4_ = uVar2;
  auVar163._0_4_ = uVar2;
  auVar163._8_4_ = uVar2;
  auVar163._12_4_ = uVar2;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar88 + 0x254);
  auVar164._4_4_ = iVar91;
  auVar164._0_4_ = iVar91;
  auVar164._8_4_ = iVar91;
  auVar164._12_4_ = iVar91;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar88 + 0x248);
  puVar76 = local_238;
  local_438[3] = (uint)((ulong)(*in)[1] >> 0x20);
  iStack_3ac = (int)((ulong)in[4][1] >> 0x20);
  local_348[7] = (uint)((ulong)in[2][1] >> 0x20);
  iStack_2ac = (int)((ulong)in[6][1] >> 0x20);
  iStack_1ac = (int)((ulong)in[5][1] >> 0x20);
  local_138[3] = (uint)((ulong)in[3][1] >> 0x20);
  iStack_ac = (int)((ulong)in[7][1] >> 0x20);
  auVar146 = pmulld(auVar145,(undefined1  [16])in[1]);
  local_48._0_8_ = CONCAT44(auVar146._4_4_ + iVar78 >> auVar121,auVar146._0_4_ + iVar78 >> auVar121)
  ;
  local_48._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_48._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar161,(undefined1  [16])in[1]);
  local_238._0_8_ =
       CONCAT44(auVar146._4_4_ + iVar78 >> auVar121,auVar146._0_4_ + iVar78 >> auVar121);
  local_238._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_238._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  auVar62._12_4_ = iStack_ac;
  auVar62._0_12_ = *(undefined1 (*) [12])in[7];
  auVar146 = pmulld(auVar162,auVar62);
  local_5c8._0_4_ = auVar146._0_4_ + iVar78 >> auVar121;
  local_5c8._4_4_ = auVar146._4_4_ + iVar78 >> auVar121;
  local_5c8._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_5c8._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  auVar147._4_4_ = iVar91;
  auVar147._0_4_ = iVar91;
  auVar147._8_4_ = iVar91;
  auVar147._12_4_ = iVar91;
  local_1c8 = local_5c8._0_4_;
  iStack_1c4 = local_5c8._4_4_;
  iStack_1c0 = local_5c8._8_4_;
  iStack_1bc = local_5c8._12_4_;
  auVar146 = pmulld(auVar154,auVar62);
  local_5d8._0_4_ = auVar146._0_4_ + iVar78 >> auVar121;
  local_5d8._4_4_ = auVar146._4_4_ + iVar78 >> auVar121;
  local_5d8._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_5d8._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  local_b8 = local_5d8._0_4_;
  iStack_b4 = local_5d8._4_4_;
  iStack_b0 = local_5d8._8_4_;
  iStack_ac = local_5d8._12_4_;
  auVar29._12_4_ = iStack_1ac;
  auVar29._0_12_ = *(undefined1 (*) [12])in[5];
  auVar146 = pmulld(auVar159,auVar29);
  local_c8._0_8_ = CONCAT44(auVar146._4_4_ + iVar78 >> auVar121,auVar146._0_4_ + iVar78 >> auVar121)
  ;
  local_c8._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_c8._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 600);
  auVar146 = pmulld(auVar163,auVar29);
  local_1b8 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_1b4 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_1b0 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_1ac = auVar146._12_4_ + iVar78 >> auVar121;
  auVar48._12_4_ = local_138[3];
  auVar48._0_12_ = *(undefined1 (*) [12])in[3];
  auVar146 = pmulld(auVar164,auVar48);
  local_148 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_144 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_140 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_13c = auVar146._12_4_ + iVar78 >> auVar121;
  auVar104._4_4_ = uVar2;
  auVar104._0_4_ = uVar2;
  auVar104._8_4_ = uVar2;
  auVar104._12_4_ = uVar2;
  auVar146 = pmulld(auVar152,auVar48);
  local_138[0] = auVar146._0_4_ + iVar78 >> auVar121;
  local_138[1] = auVar146._4_4_ + iVar78 >> auVar121;
  local_138[2] = auVar146._8_4_ + iVar78 >> auVar121;
  local_138[3] = auVar146._12_4_ + iVar78 >> auVar121;
  local_578 = CONCAT44(local_138[1],local_138[0]);
  auVar114._12_4_ = local_348[7];
  auVar114._0_12_ = *(undefined1 (*) [12])in[2];
  auVar146 = pmulld(auVar122,auVar114);
  local_248[0] = auVar146._0_4_ + iVar78 >> auVar121;
  local_248[1] = auVar146._4_4_ + iVar78 >> auVar121;
  local_248[2] = auVar146._8_4_ + iVar78 >> auVar121;
  local_248[3] = auVar146._12_4_ + iVar78 >> auVar121;
  local_588 = CONCAT44(local_248[1],local_248[0]);
  auVar146 = pmulld(auVar104,auVar114);
  local_348[4] = auVar146._0_4_ + iVar78 >> auVar121;
  local_348[5] = auVar146._4_4_ + iVar78 >> auVar121;
  local_348[6] = auVar146._8_4_ + iVar78 >> auVar121;
  local_348[7] = auVar146._12_4_ + iVar78 >> auVar121;
  local_5b8 = CONCAT44(local_348[5],local_348[4]);
  auVar11._12_4_ = iStack_2ac;
  auVar11._0_12_ = *(undefined1 (*) [12])in[6];
  auVar148 = pmulld(auVar147,auVar11);
  auVar134 = pmulld(auVar133,auVar11);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x250);
  auVar123._4_4_ = uVar2;
  auVar123._0_4_ = uVar2;
  auVar123._8_4_ = uVar2;
  auVar123._12_4_ = uVar2;
  iVar91 = -iVar79;
  auVar113._4_4_ = iVar91;
  auVar113._0_4_ = iVar91;
  auVar113._8_4_ = iVar91;
  auVar113._12_4_ = iVar91;
  auVar114 = pmulld(auVar113,local_238);
  auVar146 = pmulld(local_48,auVar123);
  auVar93._4_4_ = iVar79;
  auVar93._0_4_ = iVar79;
  auVar93._8_4_ = iVar79;
  auVar93._12_4_ = iVar79;
  local_2c8 = auVar148._0_4_ + iVar78 >> auVar121;
  iStack_2c4 = auVar148._4_4_ + iVar78 >> auVar121;
  iStack_2c0 = auVar148._8_4_ + iVar78 >> auVar121;
  iStack_2bc = auVar148._12_4_ + iVar78 >> auVar121;
  local_2b8 = auVar134._0_4_ + iVar78 >> auVar121;
  iStack_2b4 = auVar134._4_4_ + iVar78 >> auVar121;
  iStack_2b0 = auVar134._8_4_ + iVar78 >> auVar121;
  iStack_2ac = auVar134._12_4_ + iVar78 >> auVar121;
  auVar148._12_4_ = iStack_3ac;
  auVar148._0_12_ = *(undefined1 (*) [12])in[4];
  auVar105 = pmulld(auVar148,auVar93);
  auVar153 = pmulld(auVar148,auVar123);
  auVar124 = pmulld(auVar123,local_238);
  auVar134 = pmulld(auVar93,local_48);
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x1d0);
  auVar165._4_4_ = iVar79;
  auVar165._0_4_ = iVar79;
  auVar165._8_4_ = iVar79;
  auVar165._12_4_ = iVar79;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar88 + 0x1f0);
  auVar125._4_4_ = iVar91;
  auVar125._0_4_ = iVar91;
  auVar125._8_4_ = iVar91;
  auVar125._12_4_ = iVar91;
  auVar148 = pmulld(local_5c8,auVar125);
  auVar166 = pmulld(auVar165,local_5d8);
  iVar79 = -iVar79;
  auVar94._4_4_ = iVar79;
  auVar94._0_4_ = iVar79;
  auVar94._8_4_ = iVar79;
  auVar94._12_4_ = iVar79;
  auVar95 = pmulld(auVar94,local_5c8);
  auVar126 = pmulld(auVar125,local_5d8);
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x1b0);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar88 + 0x210);
  auVar149._4_4_ = uVar2;
  auVar149._0_4_ = uVar2;
  auVar149._8_4_ = uVar2;
  auVar149._12_4_ = uVar2;
  iVar91 = -iVar79;
  auVar96._4_4_ = iVar91;
  auVar96._0_4_ = iVar91;
  auVar96._8_4_ = iVar91;
  auVar96._12_4_ = iVar91;
  local_348[0] = auVar105._0_4_ + iVar78 >> auVar121;
  local_348[1] = auVar105._4_4_ + iVar78 >> auVar121;
  local_348[2] = auVar105._8_4_ + iVar78 >> auVar121;
  local_348[3] = auVar105._12_4_ + iVar78 >> auVar121;
  local_3b8 = auVar153._0_4_ + iVar78 >> auVar121;
  iStack_3b4 = auVar153._4_4_ + iVar78 >> auVar121;
  iStack_3b0 = auVar153._8_4_ + iVar78 >> auVar121;
  iStack_3ac = auVar153._12_4_ + iVar78 >> auVar121;
  local_228 = auVar114._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_224 = auVar114._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_220 = auVar114._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_21c = auVar114._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_58 = auVar124._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_54 = auVar124._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_50 = auVar124._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_4c = auVar124._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_a8._0_4_ = auVar166._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  local_a8._4_4_ = auVar166._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  local_a8._8_4_ = auVar166._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  local_a8._12_4_ = auVar166._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_1d8._0_4_ = auVar126._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  local_1d8._4_4_ = auVar126._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  local_1d8._8_4_ = auVar126._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  local_1d8._12_4_ = auVar126._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  auVar32._4_4_ = iStack_1b4;
  auVar32._0_4_ = local_1b8;
  auVar32._8_4_ = iStack_1b0;
  auVar32._12_4_ = iStack_1ac;
  auVar146 = pmulld(auVar96,auVar32);
  auVar148 = pmulld(local_c8,auVar149);
  auVar95 = pmulld(auVar32,auVar149);
  auVar135._4_4_ = iVar79;
  auVar135._0_4_ = iVar79;
  auVar135._8_4_ = iVar79;
  auVar135._12_4_ = iVar79;
  auVar134 = pmulld(auVar135,local_c8);
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 400);
  auVar160._4_4_ = iVar79;
  auVar160._0_4_ = iVar79;
  auVar160._8_4_ = iVar79;
  auVar160._12_4_ = iVar79;
  iVar91 = -*(int *)((long)vert_filter_length_chroma + lVar88 + 0x230);
  iVar79 = -iVar79;
  local_1a8 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_1a4 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_1a0 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_19c = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar155._4_4_ = iVar79;
  auVar155._0_4_ = iVar79;
  auVar155._8_4_ = iVar79;
  auVar155._12_4_ = iVar79;
  local_d8._0_4_ = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  local_d8._4_4_ = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  local_d8._8_4_ = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  local_d8._12_4_ = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar136._4_4_ = iVar91;
  auVar136._0_4_ = iVar91;
  auVar136._8_4_ = iVar91;
  auVar136._12_4_ = iVar91;
  auVar45._4_4_ = iStack_144;
  auVar45._0_4_ = local_148;
  auVar45._8_4_ = iStack_140;
  auVar45._12_4_ = iStack_13c;
  auVar148 = pmulld(auVar155,auVar45);
  auVar50._4_4_ = local_138[1];
  auVar50._0_4_ = local_138[0];
  auVar50._8_4_ = local_138[2];
  auVar50._12_4_ = local_138[3];
  auVar95 = pmulld(auVar160,auVar50);
  auVar134 = pmulld(auVar50,auVar136);
  auVar146 = pmulld(auVar45,auVar136);
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x180);
  iVar91 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x240);
  auVar150._4_4_ = iVar91;
  auVar150._0_4_ = iVar91;
  auVar150._8_4_ = iVar91;
  auVar150._12_4_ = iVar91;
  iVar84 = -iVar79;
  auVar115._4_4_ = iVar84;
  auVar115._0_4_ = iVar84;
  auVar115._8_4_ = iVar84;
  auVar115._12_4_ = iVar84;
  local_158 = auVar148._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_154 = auVar148._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_150 = auVar148._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_14c = auVar148._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_138[4] = auVar95._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  local_138[5] = auVar95._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  local_138[6] = auVar95._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_11c = auVar95._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  auVar124._8_4_ = local_348[6];
  auVar124._0_8_ = local_5b8;
  auVar124._12_4_ = local_348[7];
  auVar146 = pmulld(auVar124,auVar115);
  auVar21._8_4_ = local_248[2];
  auVar21._0_8_ = local_588;
  auVar21._12_4_ = local_248[3];
  auVar134 = pmulld(auVar21,auVar150);
  auVar106._4_4_ = iVar79;
  auVar106._0_4_ = iVar79;
  auVar106._8_4_ = iVar79;
  auVar106._12_4_ = iVar79;
  auVar95 = pmulld(auVar124,auVar150);
  auVar148 = pmulld(auVar21,auVar106);
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x1c0);
  iVar84 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x200);
  iVar85 = -iVar79;
  auVar116._4_4_ = iVar85;
  auVar116._0_4_ = iVar85;
  auVar116._8_4_ = iVar85;
  auVar116._12_4_ = iVar85;
  local_348[8] = auVar134._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  local_348[9] = auVar134._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  local_348[10] = auVar134._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_31c = auVar134._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  iVar85 = -iVar84;
  local_258 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_254 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_250 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_24c = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar137._4_4_ = iVar85;
  auVar137._0_4_ = iVar85;
  auVar137._8_4_ = iVar85;
  auVar137._12_4_ = iVar85;
  auVar169._4_4_ = iStack_2c4;
  auVar169._0_4_ = local_2c8;
  auVar169._8_4_ = iStack_2c0;
  auVar169._12_4_ = iStack_2bc;
  auVar95 = pmulld(auVar169,auVar116);
  auVar13._4_4_ = iStack_2b4;
  auVar13._0_4_ = local_2b8;
  auVar13._8_4_ = iStack_2b0;
  auVar13._12_4_ = iStack_2ac;
  auVar134 = pmulld(auVar13,auVar137);
  auVar117._4_4_ = iVar79;
  auVar117._0_4_ = iVar79;
  auVar117._8_4_ = iVar79;
  auVar117._12_4_ = iVar79;
  auVar148 = pmulld(auVar169,auVar137);
  auVar146 = pmulld(auVar13,auVar117);
  local_2d8 = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_2d4 = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_2d0 = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_2cc = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_2a8 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_2a4 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_2a0 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_29c = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  iVar79 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x1a0);
  iVar85 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x1e0);
  iVar86 = *(int *)((long)vert_filter_length_chroma + lVar88 + 0x220);
  auVar127._4_4_ = iVar85;
  auVar127._0_4_ = iVar85;
  auVar127._8_4_ = iVar85;
  auVar127._12_4_ = iVar85;
  auVar168._4_4_ = iVar86;
  auVar168._0_4_ = iVar86;
  auVar168._8_4_ = iVar86;
  auVar168._12_4_ = iVar86;
  iVar83 = -iVar79;
  auVar151._4_4_ = iVar83;
  auVar151._0_4_ = iVar83;
  auVar151._8_4_ = iVar83;
  auVar151._12_4_ = iVar83;
  auVar146._4_4_ = iStack_54;
  auVar146._0_4_ = local_58;
  auVar146._8_4_ = iStack_50;
  auVar146._12_4_ = iStack_4c;
  auVar134._12_4_ = local_438[3];
  auVar134._0_12_ = *(undefined1 (*) [12])*in;
  auVar134 = pmulld(auVar134,auVar127);
  local_438[4] = auVar134._0_4_ + iVar78 >> auVar121;
  local_438[5] = auVar134._4_4_ + iVar78 >> auVar121;
  local_438[6] = auVar134._8_4_ + iVar78 >> auVar121;
  local_438[7] = auVar134._12_4_ + iVar78 >> auVar121;
  local_438[0] = local_438[4];
  local_438[1] = local_438[5];
  local_438[2] = local_438[6];
  local_438[3] = local_438[7];
  auVar95._4_4_ = iStack_3b4;
  auVar95._0_4_ = local_3b8;
  auVar95._8_4_ = iStack_3b0;
  auVar95._12_4_ = iStack_3ac;
  auVar134 = pmulld(auVar95,auVar151);
  auVar105._4_4_ = local_348[1];
  auVar105._0_4_ = local_348[0];
  auVar105._8_4_ = local_348[2];
  auVar105._12_4_ = local_348[3];
  auVar114 = pmulld(auVar105,auVar168);
  auVar128._4_4_ = iVar79;
  auVar128._0_4_ = iVar79;
  auVar128._8_4_ = iVar79;
  auVar128._12_4_ = iVar79;
  auVar95 = pmulld(auVar95,auVar168);
  auVar148 = pmulld(auVar105,auVar128);
  local_3a8 = auVar114._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_3a4 = auVar114._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_3a0 = auVar114._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_39c = auVar114._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_358 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_354 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_350 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_34c = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar22._4_4_ = iStack_224;
  auVar22._0_4_ = local_228;
  auVar22._8_4_ = iStack_220;
  auVar22._12_4_ = iStack_21c;
  auVar134 = pmulld(auVar22,auVar150);
  auVar95 = pmulld(auVar146,auVar106);
  auVar148 = pmulld(auVar22,auVar115);
  auVar146 = pmulld(auVar146,auVar150);
  iStack_64 = auVar134._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  local_68 = auVar134._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_60 = auVar134._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_5c = auVar134._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  local_218 = auVar148._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_214 = auVar148._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_210 = auVar148._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_20c = auVar148._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  auVar23._8_4_ = local_238._8_4_;
  auVar23._0_8_ = local_238._0_8_;
  auVar23._12_4_ = local_238._12_4_;
  auVar134 = pmulld(auVar23,auVar115);
  auVar68._8_4_ = local_48._8_4_;
  auVar68._0_8_ = local_48._0_8_;
  auVar68._12_4_ = local_48._12_4_;
  auVar95 = pmulld(auVar68,auVar150);
  auVar148 = pmulld(auVar68,auVar106);
  auVar146 = pmulld(auVar23,auVar150);
  local_78 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_74 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_70 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_6c = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_208 = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_204 = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_200 = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_1fc = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  iVar91 = -iVar91;
  auVar97._4_4_ = iVar91;
  auVar97._0_4_ = iVar91;
  auVar97._8_4_ = iVar91;
  auVar97._12_4_ = iVar91;
  auVar24._8_4_ = local_5c8._8_4_;
  auVar24._0_8_ = local_5c8._0_8_;
  auVar24._12_4_ = local_5c8._12_4_;
  auVar134 = pmulld(auVar24,auVar97);
  auVar66._8_4_ = local_5d8._8_4_;
  auVar66._0_8_ = local_5d8._0_8_;
  auVar66._12_4_ = local_5d8._12_4_;
  auVar95 = pmulld(auVar66,auVar115);
  auVar146 = pmulld(auVar24,auVar115);
  auVar148 = pmulld(auVar66,auVar150);
  local_88 = auVar148._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_84 = auVar148._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_80 = auVar148._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_7c = auVar148._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_1f8 = auVar134._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_1f4 = auVar134._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  iStack_1f0 = auVar134._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_1ec = auVar134._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  auVar26._4_4_ = local_1d8._4_4_;
  auVar26._0_4_ = local_1d8._0_4_;
  auVar26._8_4_ = local_1d8._8_4_;
  auVar26._12_4_ = local_1d8._12_4_;
  auVar146 = pmulld(auVar97,auVar26);
  auVar64._4_4_ = local_a8._4_4_;
  auVar64._0_4_ = local_a8._0_4_;
  auVar64._8_4_ = local_a8._8_4_;
  auVar64._12_4_ = local_a8._12_4_;
  auVar95 = pmulld(auVar64,auVar115);
  auVar134 = pmulld(auVar26,auVar115);
  auVar148 = pmulld(auVar64,auVar150);
  local_98 = auVar148._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_94 = auVar148._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_90 = auVar148._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_8c = auVar148._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_1e8 = auVar146._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_1e4 = auVar146._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  iStack_1e0 = auVar146._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_1dc = auVar146._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  auVar35._4_4_ = iStack_1a4;
  auVar35._0_4_ = local_1a8;
  auVar35._8_4_ = iStack_1a0;
  auVar35._12_4_ = iStack_19c;
  auVar134 = pmulld(auVar35,auVar137);
  auVar59._4_4_ = local_d8._4_4_;
  auVar59._0_4_ = local_d8._0_4_;
  auVar59._8_4_ = local_d8._8_4_;
  auVar59._12_4_ = local_d8._12_4_;
  auVar95 = pmulld(auVar59,auVar117);
  auVar107._4_4_ = iVar84;
  auVar107._0_4_ = iVar84;
  auVar107._8_4_ = iVar84;
  auVar107._12_4_ = iVar84;
  auVar146 = pmulld(auVar35,auVar117);
  auVar148 = pmulld(auVar59,auVar107);
  local_e8 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_e4 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_e0 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_dc = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_198 = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_194 = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_190 = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_18c = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar38._4_4_ = iStack_1b4;
  auVar38._0_4_ = local_1b8;
  auVar38._8_4_ = iStack_1b0;
  auVar38._12_4_ = iStack_1ac;
  auVar134 = pmulld(auVar38,auVar137);
  auVar56._8_4_ = local_c8._8_4_;
  auVar56._0_8_ = local_c8._0_8_;
  auVar56._12_4_ = local_c8._12_4_;
  auVar95 = pmulld(auVar56,auVar117);
  auVar148 = pmulld(auVar56,auVar107);
  auVar146 = pmulld(auVar38,auVar117);
  local_f8 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_f4 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_f0 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_ec = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_188 = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_184 = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_180 = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_17c = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar41._4_4_ = iStack_144;
  auVar41._0_4_ = local_148;
  auVar41._8_4_ = iStack_140;
  auVar41._12_4_ = iStack_13c;
  auVar134 = pmulld(auVar41,auVar116);
  auVar54._8_4_ = local_138[2];
  auVar54._0_8_ = local_578;
  auVar54._12_4_ = local_138[3];
  auVar95 = pmulld(auVar54,auVar137);
  auVar146 = pmulld(auVar41,auVar137);
  auVar148 = pmulld(auVar54,auVar117);
  local_108 = auVar148._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_104 = auVar148._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_100 = auVar148._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_fc = auVar148._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_178 = auVar134._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_174 = auVar134._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  iStack_170 = auVar134._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_16c = auVar134._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  auVar43._4_4_ = iStack_154;
  auVar43._0_4_ = local_158;
  auVar43._8_4_ = iStack_150;
  auVar43._12_4_ = iStack_14c;
  auVar52._4_4_ = local_138[5];
  auVar52._0_4_ = local_138[4];
  auVar52._8_4_ = local_138[6];
  auVar52._12_4_ = iStack_11c;
  auVar95 = pmulld(auVar116,auVar43);
  auVar148 = pmulld(auVar52,auVar137);
  auVar146 = pmulld(auVar43,auVar137);
  auVar134 = pmulld(auVar52,auVar117);
  local_118 = auVar134._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_114 = auVar134._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_110 = auVar134._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_10c = auVar134._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_168 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_164 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_160 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_15c = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  iVar86 = -iVar86;
  local_438[0xc] = local_438[4];
  local_438[0xd] = local_438[5];
  local_438[0xe] = local_438[6];
  local_438[0xf] = local_438[7];
  local_438[8] = local_438[4];
  local_438[9] = local_438[5];
  local_438[10] = local_438[6];
  local_438[0xb] = local_438[7];
  auVar118._4_4_ = iVar86;
  auVar118._0_4_ = iVar86;
  auVar118._8_4_ = iVar86;
  auVar118._12_4_ = iVar86;
  local_388 = local_3b8;
  iStack_384 = iStack_3b4;
  iStack_380 = iStack_3b0;
  iStack_37c = iStack_3ac;
  local_398 = local_3a8;
  iStack_394 = iStack_3a4;
  iStack_390 = iStack_3a0;
  iStack_38c = iStack_39c;
  local_378 = local_348[0];
  iStack_374 = local_348[1];
  iStack_370 = local_348[2];
  iStack_36c = local_348[3];
  local_368 = local_358;
  iStack_364 = iStack_354;
  iStack_360 = iStack_350;
  iStack_35c = iStack_34c;
  auVar126._4_4_ = local_348[9];
  auVar126._0_4_ = local_348[8];
  auVar126._8_4_ = local_348[10];
  auVar126._12_4_ = iStack_31c;
  auVar20._4_4_ = iStack_254;
  auVar20._0_4_ = local_258;
  auVar20._8_4_ = iStack_250;
  auVar20._12_4_ = iStack_24c;
  auVar148 = pmulld(auVar126,auVar151);
  auVar95 = pmulld(auVar20,auVar168);
  auVar146 = pmulld(auVar126,auVar168);
  auVar134 = pmulld(auVar20,auVar128);
  local_268 = auVar146._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_264 = auVar146._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_260 = auVar146._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_25c = auVar146._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_318 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_314 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_310 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_30c = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar153._8_4_ = local_348[6];
  auVar153._0_8_ = local_5b8;
  auVar153._12_4_ = local_348[7];
  auVar19._8_4_ = local_248[2];
  auVar19._0_8_ = local_588;
  auVar19._12_4_ = local_248[3];
  auVar148 = pmulld(auVar153,auVar151);
  auVar95 = pmulld(auVar19,auVar168);
  auVar146 = pmulld(auVar153,auVar168);
  auVar134 = pmulld(auVar19,auVar128);
  local_278 = auVar146._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_274 = auVar146._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_270 = auVar146._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_26c = auVar146._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_308 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_304 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_300 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_2fc = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar166._4_4_ = iStack_2c4;
  auVar166._0_4_ = local_2c8;
  auVar166._8_4_ = iStack_2c0;
  auVar166._12_4_ = iStack_2bc;
  auVar17._4_4_ = iStack_2b4;
  auVar17._0_4_ = local_2b8;
  auVar17._8_4_ = iStack_2b0;
  auVar17._12_4_ = iStack_2ac;
  auVar148 = pmulld(auVar166,auVar118);
  auVar95 = pmulld(auVar17,auVar151);
  auVar146 = pmulld(auVar166,auVar151);
  auVar134 = pmulld(auVar17,auVar168);
  local_288 = auVar134._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_284 = auVar134._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_280 = auVar134._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_27c = auVar134._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_2f8 = auVar148._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_2f4 = auVar148._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  iStack_2f0 = auVar148._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_2ec = auVar148._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  auVar167._4_4_ = iStack_2d4;
  auVar167._0_4_ = local_2d8;
  auVar167._8_4_ = iStack_2d0;
  auVar167._12_4_ = iStack_2cc;
  auVar15._4_4_ = iStack_2a4;
  auVar15._0_4_ = local_2a8;
  auVar15._8_4_ = iStack_2a0;
  auVar15._12_4_ = iStack_29c;
  auVar95 = pmulld(auVar167,auVar118);
  auVar148 = pmulld(auVar15,auVar151);
  iVar79 = -iVar80;
  auVar146 = pmulld(auVar167,auVar151);
  auVar134 = pmulld(auVar15,auVar168);
  iVar80 = iVar80 + -1;
  local_298 = auVar134._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_294 = auVar134._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_290 = auVar134._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_28c = auVar134._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  iVar85 = -iVar85;
  local_2e8 = auVar95._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_2e4 = auVar95._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_2e0 = auVar95._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_2dc = auVar95._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  uVar81 = 0x20;
  do {
    lVar88 = 0;
    uVar87 = uVar81;
    do {
      piVar1 = (int *)(puVar76 + lVar88);
      uVar89 = uVar87 ^ 7;
      iVar131 = local_438[uVar89 * 4] + *piVar1;
      iVar139 = local_438[uVar89 * 4 + 1] + piVar1[1];
      iVar141 = local_438[uVar89 * 4 + 2] + piVar1[2];
      iVar143 = local_438[uVar89 * 4 + 3] + piVar1[3];
      iVar91 = *piVar1 - local_438[uVar89 * 4];
      iVar84 = piVar1[1] - local_438[uVar89 * 4 + 1];
      iVar86 = piVar1[2] - local_438[uVar89 * 4 + 2];
      iVar83 = piVar1[3] - local_438[uVar89 * 4 + 3];
      uVar132 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
      uVar140 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
      uVar142 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
      uVar144 = (uint)(iVar143 < iVar79) * iVar79 | (uint)(iVar143 >= iVar79) * iVar143;
      uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
      uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
      uVar102 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
      uVar103 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
      puVar77 = (uint *)(puVar76 + lVar88);
      *puVar77 = (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
      puVar77[1] = (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
      puVar77[2] = (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
      puVar77[3] = (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
      local_438[uVar89 * 4] =
           (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
      local_438[uVar89 * 4 + 1] =
           (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
      local_438[uVar89 * 4 + 2] =
           (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
      local_438[uVar89 * 4 + 3] =
           (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
      uVar89 = uVar87 ^ 0xf;
      uVar90 = uVar87 ^ 8;
      iVar131 = local_438[uVar90 * 4] + local_438[uVar89 * 4];
      iVar139 = local_438[uVar90 * 4 + 1] + local_438[uVar89 * 4 + 1];
      iVar141 = local_438[uVar90 * 4 + 2] + local_438[uVar89 * 4 + 2];
      iVar143 = local_438[uVar90 * 4 + 3] + local_438[uVar89 * 4 + 3];
      iVar91 = local_438[uVar89 * 4] - local_438[uVar90 * 4];
      iVar84 = local_438[uVar89 * 4 + 1] - local_438[uVar90 * 4 + 1];
      iVar86 = local_438[uVar89 * 4 + 2] - local_438[uVar90 * 4 + 2];
      iVar83 = local_438[uVar89 * 4 + 3] - local_438[uVar90 * 4 + 3];
      uVar132 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
      uVar140 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
      uVar142 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
      uVar144 = (uint)(iVar143 < iVar79) * iVar79 | (uint)(iVar143 >= iVar79) * iVar143;
      uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
      uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
      uVar102 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
      uVar103 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
      local_438[uVar89 * 4] =
           (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
      local_438[uVar89 * 4 + 1] =
           (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
      local_438[uVar89 * 4 + 2] =
           (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
      local_438[uVar89 * 4 + 3] =
           (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
      local_438[uVar90 * 4] =
           (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
      local_438[uVar90 * 4 + 1] =
           (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
      local_438[uVar90 * 4 + 2] =
           (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
      local_438[uVar90 * 4 + 3] =
           (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
      uVar87 = uVar87 + 1;
      lVar88 = lVar88 + 0x10;
    } while (lVar88 != 0x40);
    puVar76 = puVar76 + 0x100;
    uVar92 = (uint)uVar81;
    uVar81 = uVar81 + 0x10;
  } while (uVar92 < 0x30);
  auVar119._4_4_ = iVar85;
  auVar119._0_4_ = iVar85;
  auVar119._8_4_ = iVar85;
  auVar119._12_4_ = iVar85;
  puVar77 = local_348;
  local_3c8 = CONCAT44(local_438[1],local_438[0]);
  uStack_3c0 = CONCAT44(local_438[3],local_438[2]);
  local_3d8 = CONCAT44(local_438[5],local_438[4]);
  uStack_3d0 = CONCAT44(local_438[7],local_438[6]);
  local_3e8 = CONCAT44(local_438[9],local_438[8]);
  uStack_3e0 = CONCAT44(local_438[0xb],local_438[10]);
  local_3f8 = CONCAT44(local_438[0xd],local_438[0xc]);
  uStack_3f0 = CONCAT44(local_438[0xf],local_438[0xe]);
  auVar3._4_4_ = iStack_394;
  auVar3._0_4_ = local_398;
  auVar3._8_4_ = iStack_390;
  auVar3._12_4_ = iStack_38c;
  auVar6._4_4_ = iStack_364;
  auVar6._0_4_ = local_368;
  auVar6._8_4_ = iStack_360;
  auVar6._12_4_ = iStack_35c;
  auVar108._0_4_ = local_368 + local_398;
  auVar108._4_4_ = iStack_364 + iStack_394;
  auVar108._8_4_ = iStack_360 + iStack_390;
  auVar108._12_4_ = iStack_35c + iStack_38c;
  auVar146 = pmulld(auVar3,auVar119);
  auVar148 = pmulld(auVar6,auVar127);
  auVar134 = pmulld(auVar108,auVar127);
  local_368 = auVar134._0_4_ + iVar78 >> auVar121;
  iStack_364 = auVar134._4_4_ + iVar78 >> auVar121;
  iStack_360 = auVar134._8_4_ + iVar78 >> auVar121;
  iStack_35c = auVar134._12_4_ + iVar78 >> auVar121;
  local_398 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_394 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_390 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_38c = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  auVar4._4_4_ = iStack_384;
  auVar4._0_4_ = local_388;
  auVar4._8_4_ = iStack_380;
  auVar4._12_4_ = iStack_37c;
  auVar5._4_4_ = iStack_374;
  auVar5._0_4_ = local_378;
  auVar5._8_4_ = iStack_370;
  auVar5._12_4_ = iStack_36c;
  auVar109._0_4_ = local_378 + local_388;
  auVar109._4_4_ = iStack_374 + iStack_384;
  auVar109._8_4_ = iStack_370 + iStack_380;
  auVar109._12_4_ = iStack_36c + iStack_37c;
  auVar146 = pmulld(auVar4,auVar119);
  auVar148 = pmulld(auVar5,auVar127);
  auVar134 = pmulld(auVar109,auVar127);
  local_378 = auVar134._0_4_ + iVar78 >> auVar121;
  iStack_374 = auVar134._4_4_ + iVar78 >> auVar121;
  iStack_370 = auVar134._8_4_ + iVar78 >> auVar121;
  iStack_36c = auVar134._12_4_ + iVar78 >> auVar121;
  local_388 = auVar146._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_384 = auVar146._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_380 = auVar146._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_37c = auVar146._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  uVar81 = 0x10;
  do {
    puVar77 = puVar77 + 4;
    uVar87 = uVar81 ^ 7;
    iVar83 = local_438[uVar87 * 4] + *puVar77;
    iVar131 = local_438[uVar87 * 4 + 1] + puVar77[1];
    iVar139 = local_438[uVar87 * 4 + 2] + puVar77[2];
    iVar141 = local_438[uVar87 * 4 + 3] + puVar77[3];
    iVar91 = *puVar77 - local_438[uVar87 * 4];
    iVar84 = puVar77[1] - local_438[uVar87 * 4 + 1];
    iVar85 = puVar77[2] - local_438[uVar87 * 4 + 2];
    iVar86 = puVar77[3] - local_438[uVar87 * 4 + 3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar102 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    uVar103 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    *puVar77 = (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    puVar77[1] = (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    puVar77[2] = (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    puVar77[3] = (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    local_438[uVar87 * 4] = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92
    ;
    local_438[uVar87 * 4 + 1] =
         (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    local_438[uVar87 * 4 + 2] =
         (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    local_438[uVar87 * 4 + 3] =
         (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    uVar87 = uVar81 ^ 0xf;
    uVar89 = uVar81 ^ 8;
    iVar83 = local_438[uVar89 * 4] + local_438[uVar87 * 4];
    iVar131 = local_438[uVar89 * 4 + 1] + local_438[uVar87 * 4 + 1];
    iVar139 = local_438[uVar89 * 4 + 2] + local_438[uVar87 * 4 + 2];
    iVar141 = local_438[uVar89 * 4 + 3] + local_438[uVar87 * 4 + 3];
    iVar91 = local_438[uVar87 * 4] - local_438[uVar89 * 4];
    iVar84 = local_438[uVar87 * 4 + 1] - local_438[uVar89 * 4 + 1];
    iVar85 = local_438[uVar87 * 4 + 2] - local_438[uVar89 * 4 + 2];
    iVar86 = local_438[uVar87 * 4 + 3] - local_438[uVar89 * 4 + 3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar102 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    uVar103 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    local_438[uVar87 * 4] =
         (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    local_438[uVar87 * 4 + 1] =
         (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    local_438[uVar87 * 4 + 2] =
         (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    local_438[uVar87 * 4 + 3] =
         (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    local_438[uVar89 * 4] = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92
    ;
    local_438[uVar89 * 4 + 1] =
         (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    local_438[uVar89 * 4 + 2] =
         (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    local_438[uVar89 * 4 + 3] =
         (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    uVar81 = uVar81 + 1;
  } while (uVar81 != 0x14);
  puVar77 = local_348;
  auVar25._4_4_ = iStack_1f4;
  auVar25._0_4_ = local_1f8;
  auVar25._8_4_ = iStack_1f0;
  auVar25._12_4_ = iStack_1ec;
  auVar27._4_4_ = iStack_1e4;
  auVar27._0_4_ = local_1e8;
  auVar27._8_4_ = iStack_1e0;
  auVar27._12_4_ = iStack_1dc;
  auVar28._4_4_ = iStack_1c4;
  auVar28._0_4_ = local_1c8;
  auVar28._8_4_ = iStack_1c0;
  auVar28._12_4_ = iStack_1bc;
  auVar124 = pmulld(auVar25,auVar151);
  auVar67._4_4_ = iStack_84;
  auVar67._0_4_ = local_88;
  auVar67._8_4_ = iStack_80;
  auVar67._12_4_ = iStack_7c;
  auVar146 = pmulld(auVar67,auVar168);
  auVar153 = pmulld(auVar27,auVar151);
  auVar65._4_4_ = iStack_94;
  auVar65._0_4_ = local_98;
  auVar65._8_4_ = iStack_90;
  auVar65._12_4_ = iStack_8c;
  auVar148 = pmulld(auVar65,auVar168);
  auVar167 = pmulld(local_1d8,auVar151);
  auVar95 = pmulld(local_a8,auVar168);
  auVar114 = pmulld(auVar28,auVar151);
  auVar63._4_4_ = iStack_b4;
  auVar63._0_4_ = local_b8;
  auVar63._8_4_ = iStack_b0;
  auVar63._12_4_ = iStack_ac;
  auVar166 = pmulld(auVar63,auVar168);
  auVar126 = pmulld(auVar28,auVar168);
  auVar105 = pmulld(auVar63,auVar128);
  auVar169 = pmulld(local_1d8,auVar168);
  auVar134 = pmulld(local_a8,auVar128);
  local_b8 = auVar126._0_4_ + iVar78 + auVar105._0_4_ >> auVar121;
  iStack_b4 = auVar126._4_4_ + iVar78 + auVar105._4_4_ >> auVar121;
  iStack_b0 = auVar126._8_4_ + iVar78 + auVar105._8_4_ >> auVar121;
  iStack_ac = auVar126._12_4_ + iVar78 + auVar105._12_4_ >> auVar121;
  local_a8._4_4_ = auVar169._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  local_a8._0_4_ = auVar169._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  local_a8._8_4_ = auVar169._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  local_a8._12_4_ = auVar169._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar105 = pmulld(auVar27,auVar168);
  auVar134 = pmulld(auVar65,auVar128);
  local_98 = auVar105._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_94 = auVar105._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_90 = auVar105._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_8c = auVar105._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar105 = pmulld(auVar25,auVar168);
  auVar134 = pmulld(auVar67,auVar128);
  local_88 = auVar105._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_84 = auVar105._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_80 = auVar105._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_7c = auVar105._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_1f8 = auVar124._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_1f4 = auVar124._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_1f0 = auVar124._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_1ec = auVar124._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_1e8 = auVar153._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_1e4 = auVar153._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_1e0 = auVar153._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_1dc = auVar153._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_1d8._4_4_ = auVar167._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  local_1d8._0_4_ = auVar167._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  local_1d8._8_4_ = auVar167._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  local_1d8._12_4_ = auVar167._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  local_1c8 = auVar114._0_4_ + iVar78 + auVar166._0_4_ >> auVar121;
  iStack_1c4 = auVar114._4_4_ + iVar78 + auVar166._4_4_ >> auVar121;
  iStack_1c0 = auVar114._8_4_ + iVar78 + auVar166._8_4_ >> auVar121;
  iStack_1bc = auVar114._12_4_ + iVar78 + auVar166._12_4_ >> auVar121;
  auVar30._4_4_ = iStack_1b4;
  auVar30._0_4_ = local_1b8;
  auVar30._8_4_ = iStack_1b0;
  auVar30._12_4_ = iStack_1ac;
  auVar124 = pmulld(auVar30,auVar118);
  auVar146 = pmulld(local_c8,auVar151);
  auVar33._4_4_ = iStack_1a4;
  auVar33._0_4_ = local_1a8;
  auVar33._8_4_ = iStack_1a0;
  auVar33._12_4_ = iStack_19c;
  auVar126 = pmulld(auVar33,auVar118);
  auVar148 = pmulld(local_d8,auVar151);
  auVar36._4_4_ = iStack_194;
  auVar36._0_4_ = local_198;
  auVar36._8_4_ = iStack_190;
  auVar36._12_4_ = iStack_18c;
  auVar153 = pmulld(auVar36,auVar118);
  auVar60._4_4_ = iStack_e4;
  auVar60._0_4_ = local_e8;
  auVar60._8_4_ = iStack_e0;
  auVar60._12_4_ = iStack_dc;
  auVar95 = pmulld(auVar60,auVar151);
  auVar39._4_4_ = iStack_184;
  auVar39._0_4_ = local_188;
  auVar39._8_4_ = iStack_180;
  auVar39._12_4_ = iStack_17c;
  auVar105 = pmulld(auVar118,auVar39);
  auVar57._4_4_ = iStack_f4;
  auVar57._0_4_ = local_f8;
  auVar57._8_4_ = iStack_f0;
  auVar57._12_4_ = iStack_ec;
  auVar134 = pmulld(auVar39,auVar151);
  auVar114 = pmulld(auVar57,auVar168);
  auVar166 = pmulld(auVar57,auVar151);
  local_f8 = auVar134._0_4_ + iVar78 + auVar114._0_4_ >> auVar121;
  iStack_f4 = auVar134._4_4_ + iVar78 + auVar114._4_4_ >> auVar121;
  iStack_f0 = auVar134._8_4_ + iVar78 + auVar114._8_4_ >> auVar121;
  iStack_ec = auVar134._12_4_ + iVar78 + auVar114._12_4_ >> auVar121;
  auVar134 = pmulld(auVar36,auVar151);
  auVar114 = pmulld(auVar60,auVar168);
  local_e8 = auVar134._0_4_ + iVar78 + auVar114._0_4_ >> auVar121;
  iStack_e4 = auVar134._4_4_ + iVar78 + auVar114._4_4_ >> auVar121;
  iStack_e0 = auVar134._8_4_ + iVar78 + auVar114._8_4_ >> auVar121;
  iStack_dc = auVar134._12_4_ + iVar78 + auVar114._12_4_ >> auVar121;
  auVar114 = pmulld(auVar33,auVar151);
  auVar134 = pmulld(local_d8,auVar168);
  local_d8._4_4_ = auVar114._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  local_d8._0_4_ = auVar114._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  local_d8._8_4_ = auVar114._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  local_d8._12_4_ = auVar114._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  auVar114 = pmulld(auVar30,auVar151);
  auVar134 = pmulld(local_c8,auVar168);
  local_c8._4_4_ = auVar114._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  local_c8._0_4_ = auVar114._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  local_c8._8_4_ = auVar114._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  local_c8._12_4_ = auVar114._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_1b8 = auVar124._0_4_ + iVar78 + auVar146._0_4_ >> auVar121;
  iStack_1b4 = auVar124._4_4_ + iVar78 + auVar146._4_4_ >> auVar121;
  iStack_1b0 = auVar124._8_4_ + iVar78 + auVar146._8_4_ >> auVar121;
  iStack_1ac = auVar124._12_4_ + iVar78 + auVar146._12_4_ >> auVar121;
  local_1a8 = auVar126._0_4_ + iVar78 + auVar148._0_4_ >> auVar121;
  iStack_1a4 = auVar126._4_4_ + iVar78 + auVar148._4_4_ >> auVar121;
  iStack_1a0 = auVar126._8_4_ + iVar78 + auVar148._8_4_ >> auVar121;
  iStack_19c = auVar126._12_4_ + iVar78 + auVar148._12_4_ >> auVar121;
  local_198 = auVar153._0_4_ + iVar78 + auVar95._0_4_ >> auVar121;
  iStack_194 = auVar153._4_4_ + iVar78 + auVar95._4_4_ >> auVar121;
  iStack_190 = auVar153._8_4_ + iVar78 + auVar95._8_4_ >> auVar121;
  iStack_18c = auVar153._12_4_ + iVar78 + auVar95._12_4_ >> auVar121;
  local_188 = auVar105._0_4_ + iVar78 + auVar166._0_4_ >> auVar121;
  iStack_184 = auVar105._4_4_ + iVar78 + auVar166._4_4_ >> auVar121;
  iStack_180 = auVar105._8_4_ + iVar78 + auVar166._8_4_ >> auVar121;
  iStack_17c = auVar105._12_4_ + iVar78 + auVar166._12_4_ >> auVar121;
  lVar88 = 0;
  do {
    iVar91 = *(int *)((long)local_438 + lVar88 + 4);
    iVar84 = *(int *)((long)local_438 + lVar88 + 8);
    iVar85 = *(int *)((long)local_438 + lVar88 + 0xc);
    iVar83 = *puVar77 + *(int *)((long)local_438 + lVar88);
    iVar131 = puVar77[1] + iVar91;
    iVar139 = puVar77[2] + iVar84;
    iVar141 = puVar77[3] + iVar85;
    iVar86 = *(int *)((long)local_438 + lVar88) - *puVar77;
    iVar91 = iVar91 - puVar77[1];
    iVar84 = iVar84 - puVar77[2];
    iVar85 = iVar85 - puVar77[3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    uVar101 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar102 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar103 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    *(uint *)((long)local_438 + lVar88) =
         (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    *(uint *)((long)local_438 + lVar88 + 4) =
         (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    *(uint *)((long)local_438 + lVar88 + 8) =
         (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    *(uint *)((long)local_438 + lVar88 + 0xc) =
         (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    *puVar77 = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
    puVar77[1] = (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    puVar77[2] = (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    puVar77[3] = (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    lVar88 = lVar88 + 0x10;
    puVar77 = puVar77 + -4;
  } while (lVar88 != 0x80);
  puVar77 = (uint *)local_238;
  auVar7._4_4_ = iStack_2f4;
  auVar7._0_4_ = local_2f8;
  auVar7._8_4_ = iStack_2f0;
  auVar7._12_4_ = iStack_2ec;
  auVar8._4_4_ = iStack_2e4;
  auVar8._0_4_ = local_2e8;
  auVar8._8_4_ = iStack_2e0;
  auVar8._12_4_ = iStack_2dc;
  auVar9._4_4_ = iStack_2d4;
  auVar9._0_4_ = local_2d8;
  auVar9._8_4_ = iStack_2d0;
  auVar9._12_4_ = iStack_2cc;
  auVar10._4_4_ = iStack_2c4;
  auVar10._0_4_ = local_2c8;
  auVar10._8_4_ = iStack_2c0;
  auVar10._12_4_ = iStack_2bc;
  auVar18._4_4_ = iStack_284;
  auVar18._0_4_ = local_288;
  auVar18._8_4_ = iStack_280;
  auVar18._12_4_ = iStack_27c;
  auVar98._0_4_ = local_288 + local_2f8;
  auVar98._4_4_ = iStack_284 + iStack_2f4;
  auVar98._8_4_ = iStack_280 + iStack_2f0;
  auVar98._12_4_ = iStack_27c + iStack_2ec;
  auVar124 = pmulld(auVar7,auVar119);
  auVar126 = pmulld(auVar18,auVar127);
  auVar16._4_4_ = iStack_294;
  auVar16._0_4_ = local_298;
  auVar16._8_4_ = iStack_290;
  auVar16._12_4_ = iStack_28c;
  auVar129._0_4_ = local_298 + local_2e8;
  auVar129._4_4_ = iStack_294 + iStack_2e4;
  auVar129._8_4_ = iStack_290 + iStack_2e0;
  auVar129._12_4_ = iStack_28c + iStack_2dc;
  auVar114 = pmulld(auVar8,auVar119);
  auVar134 = pmulld(auVar16,auVar127);
  auVar14._4_4_ = iStack_2a4;
  auVar14._0_4_ = local_2a8;
  auVar14._8_4_ = iStack_2a0;
  auVar14._12_4_ = iStack_29c;
  auVar110._0_4_ = local_2a8 + local_2d8;
  auVar110._4_4_ = iStack_2a4 + iStack_2d4;
  auVar110._8_4_ = iStack_2a0 + iStack_2d0;
  auVar110._12_4_ = iStack_29c + iStack_2cc;
  auVar105 = pmulld(auVar9,auVar119);
  auVar153 = pmulld(auVar14,auVar127);
  auVar12._4_4_ = iStack_2b4;
  auVar12._0_4_ = local_2b8;
  auVar12._8_4_ = iStack_2b0;
  auVar12._12_4_ = iStack_2ac;
  auVar156._0_4_ = local_2b8 + local_2c8;
  auVar156._4_4_ = iStack_2b4 + iStack_2c4;
  auVar156._8_4_ = iStack_2b0 + iStack_2c0;
  auVar156._12_4_ = iStack_2ac + iStack_2bc;
  auVar148 = pmulld(auVar10,auVar119);
  auVar166 = pmulld(auVar12,auVar127);
  auVar146 = pmulld(auVar156,auVar127);
  local_2b8 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_2b4 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_2b0 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_2ac = auVar146._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar110,auVar127);
  auVar95 = pmulld(auVar129,auVar127);
  local_2a8 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_2a4 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_2a0 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_29c = auVar146._12_4_ + iVar78 >> auVar121;
  local_298 = auVar95._0_4_ + iVar78 >> auVar121;
  iStack_294 = auVar95._4_4_ + iVar78 >> auVar121;
  iStack_290 = auVar95._8_4_ + iVar78 >> auVar121;
  iStack_28c = auVar95._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar98,auVar127);
  local_288 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_284 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_280 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_27c = auVar146._12_4_ + iVar78 >> auVar121;
  local_2f8 = auVar124._0_4_ + iVar78 + auVar126._0_4_ >> auVar121;
  iStack_2f4 = auVar124._4_4_ + iVar78 + auVar126._4_4_ >> auVar121;
  iStack_2f0 = auVar124._8_4_ + iVar78 + auVar126._8_4_ >> auVar121;
  iStack_2ec = auVar124._12_4_ + iVar78 + auVar126._12_4_ >> auVar121;
  local_2e8 = auVar114._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_2e4 = auVar114._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_2e0 = auVar114._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_2dc = auVar114._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_2d8 = auVar105._0_4_ + iVar78 + auVar153._0_4_ >> auVar121;
  iStack_2d4 = auVar105._4_4_ + iVar78 + auVar153._4_4_ >> auVar121;
  iStack_2d0 = auVar105._8_4_ + iVar78 + auVar153._8_4_ >> auVar121;
  iStack_2cc = auVar105._12_4_ + iVar78 + auVar153._12_4_ >> auVar121;
  local_2c8 = auVar148._0_4_ + iVar78 + auVar166._0_4_ >> auVar121;
  iStack_2c4 = auVar148._4_4_ + iVar78 + auVar166._4_4_ >> auVar121;
  iStack_2c0 = auVar148._8_4_ + iVar78 + auVar166._8_4_ >> auVar121;
  iStack_2bc = auVar148._12_4_ + iVar78 + auVar166._12_4_ >> auVar121;
  uVar81 = 0x20;
  do {
    uVar87 = uVar81 ^ 0xf;
    iVar83 = local_438[uVar87 * 4] + *puVar77;
    iVar131 = local_438[uVar87 * 4 + 1] + puVar77[1];
    iVar139 = local_438[uVar87 * 4 + 2] + puVar77[2];
    iVar141 = local_438[uVar87 * 4 + 3] + puVar77[3];
    iVar91 = *puVar77 - local_438[uVar87 * 4];
    iVar84 = puVar77[1] - local_438[uVar87 * 4 + 1];
    iVar85 = puVar77[2] - local_438[uVar87 * 4 + 2];
    iVar86 = puVar77[3] - local_438[uVar87 * 4 + 3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar102 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    uVar103 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    *puVar77 = (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    puVar77[1] = (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    puVar77[2] = (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    puVar77[3] = (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    local_438[uVar87 * 4] = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92
    ;
    local_438[uVar87 * 4 + 1] =
         (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    local_438[uVar87 * 4 + 2] =
         (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    local_438[uVar87 * 4 + 3] =
         (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    uVar81 = uVar81 + 1;
    puVar77 = puVar77 + 4;
  } while (uVar81 != 0x28);
  uVar81 = 0x30;
  puVar77 = local_138;
  do {
    uVar87 = uVar81 ^ 0xf;
    iVar83 = *puVar77 + local_438[uVar87 * 4];
    iVar131 = puVar77[1] + local_438[uVar87 * 4 + 1];
    iVar139 = puVar77[2] + local_438[uVar87 * 4 + 2];
    iVar141 = puVar77[3] + local_438[uVar87 * 4 + 3];
    iVar91 = local_438[uVar87 * 4] - *puVar77;
    iVar84 = local_438[uVar87 * 4 + 1] - puVar77[1];
    iVar85 = local_438[uVar87 * 4 + 2] - puVar77[2];
    iVar86 = local_438[uVar87 * 4 + 3] - puVar77[3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar101 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar102 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    uVar103 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    local_438[uVar87 * 4] =
         (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    local_438[uVar87 * 4 + 1] =
         (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    local_438[uVar87 * 4 + 2] =
         (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    local_438[uVar87 * 4 + 3] =
         (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    *puVar77 = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
    puVar77[1] = (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    puVar77[2] = (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    puVar77[3] = (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    uVar81 = uVar81 + 1;
    puVar77 = puVar77 + 4;
  } while (uVar81 != 0x38);
  puVar77 = local_248;
  lVar88 = 0;
  do {
    iVar91 = *(int *)((long)local_438 + lVar88 + 4);
    iVar84 = *(int *)((long)local_438 + lVar88 + 8);
    iVar85 = *(int *)((long)local_438 + lVar88 + 0xc);
    iVar83 = *puVar77 + *(int *)((long)local_438 + lVar88);
    iVar131 = puVar77[1] + iVar91;
    iVar139 = puVar77[2] + iVar84;
    iVar141 = puVar77[3] + iVar85;
    iVar86 = *(int *)((long)local_438 + lVar88) - *puVar77;
    iVar91 = iVar91 - puVar77[1];
    iVar84 = iVar84 - puVar77[2];
    iVar85 = iVar85 - puVar77[3];
    uVar132 = (uint)(iVar83 < iVar79) * iVar79 | (uint)(iVar83 >= iVar79) * iVar83;
    uVar140 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar142 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar144 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar92 = (uint)(iVar86 < iVar79) * iVar79 | (uint)(iVar86 >= iVar79) * iVar86;
    uVar101 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar102 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    uVar103 = (uint)(iVar85 < iVar79) * iVar79 | (uint)(iVar85 >= iVar79) * iVar85;
    *(uint *)((long)local_438 + lVar88) =
         (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    *(uint *)((long)local_438 + lVar88 + 4) =
         (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    *(uint *)((long)local_438 + lVar88 + 8) =
         (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    *(uint *)((long)local_438 + lVar88 + 0xc) =
         (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    *puVar77 = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
    puVar77[1] = (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    puVar77[2] = (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    puVar77[3] = (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    lVar88 = lVar88 + 0x10;
    puVar77 = puVar77 + -4;
  } while (lVar88 != 0x100);
  auVar31._4_4_ = iStack_1b4;
  auVar31._0_4_ = local_1b8;
  auVar31._8_4_ = iStack_1b0;
  auVar31._12_4_ = iStack_1ac;
  auVar34._4_4_ = iStack_1a4;
  auVar34._0_4_ = local_1a8;
  auVar34._8_4_ = iStack_1a0;
  auVar34._12_4_ = iStack_19c;
  auVar37._4_4_ = iStack_194;
  auVar37._0_4_ = local_198;
  auVar37._8_4_ = iStack_190;
  auVar37._12_4_ = iStack_18c;
  auVar99._0_4_ = local_c8._0_4_ + local_1b8;
  auVar99._4_4_ = local_c8._4_4_ + iStack_1b4;
  auVar99._8_4_ = local_c8._8_4_ + iStack_1b0;
  auVar99._12_4_ = local_c8._12_4_ + iStack_1ac;
  auVar114 = pmulld(auVar31,auVar119);
  auVar124 = pmulld(local_c8,auVar127);
  auVar130._0_4_ = local_d8._0_4_ + local_1a8;
  auVar130._4_4_ = local_d8._4_4_ + iStack_1a4;
  auVar130._8_4_ = local_d8._8_4_ + iStack_1a0;
  auVar130._12_4_ = local_d8._12_4_ + iStack_19c;
  auVar105 = pmulld(auVar34,auVar119);
  auVar134 = pmulld(local_d8,auVar127);
  auVar61._4_4_ = iStack_e4;
  auVar61._0_4_ = local_e8;
  auVar61._8_4_ = iStack_e0;
  auVar61._12_4_ = iStack_dc;
  auVar111._0_4_ = local_e8 + local_198;
  auVar111._4_4_ = iStack_e4 + iStack_194;
  auVar111._8_4_ = iStack_e0 + iStack_190;
  auVar111._12_4_ = iStack_dc + iStack_18c;
  auVar148 = pmulld(auVar37,auVar119);
  auVar126 = pmulld(auVar61,auVar127);
  auVar40._4_4_ = iStack_184;
  auVar40._0_4_ = local_188;
  auVar40._8_4_ = iStack_180;
  auVar40._12_4_ = iStack_17c;
  auVar58._4_4_ = iStack_f4;
  auVar58._0_4_ = local_f8;
  auVar58._8_4_ = iStack_f0;
  auVar58._12_4_ = iStack_ec;
  auVar157._0_4_ = local_f8 + local_188;
  auVar157._4_4_ = iStack_f4 + iStack_184;
  auVar157._8_4_ = iStack_f0 + iStack_180;
  auVar157._12_4_ = iStack_ec + iStack_17c;
  auVar153 = pmulld(auVar40,auVar119);
  auVar166 = pmulld(auVar58,auVar127);
  auVar146 = pmulld(auVar157,auVar127);
  local_f8 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_f4 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_f0 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_ec = auVar146._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar111,auVar127);
  auVar95 = pmulld(auVar130,auVar127);
  local_e8 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_e4 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_e0 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_dc = auVar146._12_4_ + iVar78 >> auVar121;
  local_d8._4_4_ = auVar95._4_4_ + iVar78 >> auVar121;
  local_d8._0_4_ = auVar95._0_4_ + iVar78 >> auVar121;
  local_d8._8_4_ = auVar95._8_4_ + iVar78 >> auVar121;
  local_d8._12_4_ = auVar95._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar99,auVar127);
  local_c8._4_4_ = auVar146._4_4_ + iVar78 >> auVar121;
  local_c8._0_4_ = auVar146._0_4_ + iVar78 >> auVar121;
  local_c8._8_4_ = auVar146._8_4_ + iVar78 >> auVar121;
  local_c8._12_4_ = auVar146._12_4_ + iVar78 >> auVar121;
  local_1b8 = auVar114._0_4_ + iVar78 + auVar124._0_4_ >> auVar121;
  iStack_1b4 = auVar114._4_4_ + iVar78 + auVar124._4_4_ >> auVar121;
  iStack_1b0 = auVar114._8_4_ + iVar78 + auVar124._8_4_ >> auVar121;
  iStack_1ac = auVar114._12_4_ + iVar78 + auVar124._12_4_ >> auVar121;
  local_1a8 = auVar105._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_1a4 = auVar105._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_1a0 = auVar105._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_19c = auVar105._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_198 = auVar148._0_4_ + iVar78 + auVar126._0_4_ >> auVar121;
  iStack_194 = auVar148._4_4_ + iVar78 + auVar126._4_4_ >> auVar121;
  iStack_190 = auVar148._8_4_ + iVar78 + auVar126._8_4_ >> auVar121;
  iStack_18c = auVar148._12_4_ + iVar78 + auVar126._12_4_ >> auVar121;
  local_188 = auVar153._0_4_ + iVar78 + auVar166._0_4_ >> auVar121;
  iStack_184 = auVar153._4_4_ + iVar78 + auVar166._4_4_ >> auVar121;
  iStack_180 = auVar153._8_4_ + iVar78 + auVar166._8_4_ >> auVar121;
  iStack_17c = auVar153._12_4_ + iVar78 + auVar166._12_4_ >> auVar121;
  auVar42._4_4_ = iStack_174;
  auVar42._0_4_ = local_178;
  auVar42._8_4_ = iStack_170;
  auVar42._12_4_ = iStack_16c;
  auVar55._4_4_ = iStack_104;
  auVar55._0_4_ = local_108;
  auVar55._8_4_ = iStack_100;
  auVar55._12_4_ = iStack_fc;
  auVar100._0_4_ = local_108 + local_178;
  auVar100._4_4_ = iStack_104 + iStack_174;
  auVar100._8_4_ = iStack_100 + iStack_170;
  auVar100._12_4_ = iStack_fc + iStack_16c;
  auVar148 = pmulld(auVar42,auVar119);
  auVar105 = pmulld(auVar55,auVar127);
  auVar44._4_4_ = iStack_164;
  auVar44._0_4_ = local_168;
  auVar44._8_4_ = iStack_160;
  auVar44._12_4_ = iStack_15c;
  auVar53._4_4_ = iStack_114;
  auVar53._0_4_ = local_118;
  auVar53._8_4_ = iStack_110;
  auVar53._12_4_ = iStack_10c;
  auVar138._0_4_ = local_118 + local_168;
  auVar138._4_4_ = iStack_114 + iStack_164;
  auVar138._8_4_ = iStack_110 + iStack_160;
  auVar138._12_4_ = iStack_10c + iStack_15c;
  auVar95 = pmulld(auVar44,auVar119);
  auVar134 = pmulld(auVar53,auVar127);
  auVar46._4_4_ = iStack_154;
  auVar46._0_4_ = local_158;
  auVar46._8_4_ = iStack_150;
  auVar46._12_4_ = iStack_14c;
  auVar51._4_4_ = local_138[5];
  auVar51._0_4_ = local_138[4];
  auVar51._8_4_ = local_138[6];
  auVar51._12_4_ = iStack_11c;
  auVar112._0_4_ = local_138[4] + local_158;
  auVar112._4_4_ = local_138[5] + iStack_154;
  auVar112._8_4_ = local_138[6] + iStack_150;
  auVar112._12_4_ = iStack_11c + iStack_14c;
  auVar124 = pmulld(auVar46,auVar119);
  auVar126 = pmulld(auVar51,auVar127);
  auVar47._4_4_ = iStack_144;
  auVar47._0_4_ = local_148;
  auVar47._8_4_ = iStack_140;
  auVar47._12_4_ = iStack_13c;
  auVar166 = pmulld(auVar119,auVar47);
  auVar49._4_4_ = local_138[1];
  auVar49._0_4_ = local_138[0];
  auVar49._8_4_ = local_138[2];
  auVar49._12_4_ = local_138[3];
  auVar153 = pmulld(auVar49,auVar127);
  auVar158._0_4_ = local_138[0] + local_148;
  auVar158._4_4_ = local_138[1] + iStack_144;
  auVar158._8_4_ = local_138[2] + iStack_140;
  auVar158._12_4_ = local_138[3] + iStack_13c;
  auVar146 = pmulld(auVar158,auVar127);
  local_138[0] = auVar146._0_4_ + iVar78 >> auVar121;
  local_138[1] = auVar146._4_4_ + iVar78 >> auVar121;
  local_138[2] = auVar146._8_4_ + iVar78 >> auVar121;
  local_138[3] = auVar146._12_4_ + iVar78 >> auVar121;
  auVar146 = pmulld(auVar112,auVar127);
  local_138[4] = auVar146._0_4_ + iVar78 >> auVar121;
  local_138[5] = auVar146._4_4_ + iVar78 >> auVar121;
  local_138[6] = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_11c = auVar146._12_4_ + iVar78 >> auVar121;
  auVar114 = pmulld(auVar138,auVar127);
  auVar146 = pmulld(auVar100,auVar127);
  local_118 = auVar114._0_4_ + iVar78 >> auVar121;
  iStack_114 = auVar114._4_4_ + iVar78 >> auVar121;
  iStack_110 = auVar114._8_4_ + iVar78 >> auVar121;
  iStack_10c = auVar114._12_4_ + iVar78 >> auVar121;
  local_108 = auVar146._0_4_ + iVar78 >> auVar121;
  iStack_104 = auVar146._4_4_ + iVar78 >> auVar121;
  iStack_100 = auVar146._8_4_ + iVar78 >> auVar121;
  iStack_fc = auVar146._12_4_ + iVar78 >> auVar121;
  local_178 = auVar148._0_4_ + iVar78 + auVar105._0_4_ >> auVar121;
  iStack_174 = auVar148._4_4_ + iVar78 + auVar105._4_4_ >> auVar121;
  iStack_170 = auVar148._8_4_ + iVar78 + auVar105._8_4_ >> auVar121;
  iStack_16c = auVar148._12_4_ + iVar78 + auVar105._12_4_ >> auVar121;
  local_168 = auVar95._0_4_ + iVar78 + auVar134._0_4_ >> auVar121;
  iStack_164 = auVar95._4_4_ + iVar78 + auVar134._4_4_ >> auVar121;
  iStack_160 = auVar95._8_4_ + iVar78 + auVar134._8_4_ >> auVar121;
  iStack_15c = auVar95._12_4_ + iVar78 + auVar134._12_4_ >> auVar121;
  local_158 = auVar124._0_4_ + iVar78 + auVar126._0_4_ >> auVar121;
  iStack_154 = auVar124._4_4_ + iVar78 + auVar126._4_4_ >> auVar121;
  iStack_150 = auVar124._8_4_ + iVar78 + auVar126._8_4_ >> auVar121;
  iStack_14c = auVar124._12_4_ + iVar78 + auVar126._12_4_ >> auVar121;
  local_148 = auVar166._0_4_ + iVar78 + auVar153._0_4_ >> auVar121;
  iStack_144 = auVar166._4_4_ + iVar78 + auVar153._4_4_ >> auVar121;
  iStack_140 = auVar166._8_4_ + iVar78 + auVar153._8_4_ >> auVar121;
  iStack_13c = auVar166._12_4_ + iVar78 + auVar153._12_4_ >> auVar121;
  lVar88 = 0x3f0;
  lVar82 = 0;
  do {
    iVar78 = *(int *)((long)local_438 + lVar82 + 4);
    iVar91 = *(int *)((long)local_438 + lVar82 + 8);
    iVar84 = *(int *)((long)local_438 + lVar82 + 0xc);
    iVar85 = *(int *)((long)local_438 + lVar88 + 4);
    iVar86 = *(int *)((long)local_438 + lVar88 + 8);
    iVar83 = *(int *)((long)local_438 + lVar88 + 0xc);
    iVar139 = *(int *)((long)local_438 + lVar88) + *(int *)((long)local_438 + lVar82);
    iVar141 = iVar85 + iVar78;
    iVar143 = iVar86 + iVar91;
    iVar120 = iVar83 + iVar84;
    iVar131 = *(int *)((long)local_438 + lVar82) - *(int *)((long)local_438 + lVar88);
    iVar78 = iVar78 - iVar85;
    iVar91 = iVar91 - iVar86;
    iVar84 = iVar84 - iVar83;
    uVar132 = (uint)(iVar139 < iVar79) * iVar79 | (uint)(iVar139 >= iVar79) * iVar139;
    uVar140 = (uint)(iVar141 < iVar79) * iVar79 | (uint)(iVar141 >= iVar79) * iVar141;
    uVar142 = (uint)(iVar143 < iVar79) * iVar79 | (uint)(iVar143 >= iVar79) * iVar143;
    uVar144 = (uint)(iVar120 < iVar79) * iVar79 | (uint)(iVar120 >= iVar79) * iVar120;
    uVar92 = (uint)(iVar131 < iVar79) * iVar79 | (uint)(iVar131 >= iVar79) * iVar131;
    uVar101 = (uint)(iVar78 < iVar79) * iVar79 | (uint)(iVar78 >= iVar79) * iVar78;
    uVar102 = (uint)(iVar91 < iVar79) * iVar79 | (uint)(iVar91 >= iVar79) * iVar91;
    uVar103 = (uint)(iVar84 < iVar79) * iVar79 | (uint)(iVar84 >= iVar79) * iVar84;
    puVar77 = (uint *)((long)*out + lVar82);
    *puVar77 = (uint)(iVar80 < (int)uVar132) * iVar80 | (iVar80 >= (int)uVar132) * uVar132;
    puVar77[1] = (uint)(iVar80 < (int)uVar140) * iVar80 | (iVar80 >= (int)uVar140) * uVar140;
    puVar77[2] = (uint)(iVar80 < (int)uVar142) * iVar80 | (iVar80 >= (int)uVar142) * uVar142;
    puVar77[3] = (uint)(iVar80 < (int)uVar144) * iVar80 | (iVar80 >= (int)uVar144) * uVar144;
    puVar77 = (uint *)((long)*out + lVar88);
    *puVar77 = (uint)(iVar80 < (int)uVar92) * iVar80 | (iVar80 >= (int)uVar92) * uVar92;
    puVar77[1] = (uint)(iVar80 < (int)uVar101) * iVar80 | (iVar80 >= (int)uVar101) * uVar101;
    puVar77[2] = (uint)(iVar80 < (int)uVar102) * iVar80 | (iVar80 >= (int)uVar102) * uVar102;
    puVar77[3] = (uint)(iVar80 < (int)uVar103) * iVar80 | (iVar80 >= (int)uVar103) * uVar103;
    lVar88 = lVar88 + -0x10;
    lVar82 = lVar82 + 0x10;
  } while (lVar88 != 0x1f0);
  if (do_cols == 0) {
    iVar80 = 10;
    if (10 < bd) {
      iVar80 = bd;
    }
    local_458 = 0x20 << ((byte)iVar80 & 0x1f);
    local_448 = -local_458;
    local_458 = local_458 + -1;
    iVar80 = 1 << ((char)out_shift - 1U & 0x1f);
    uVar81 = 0xfffffffffffffffc;
    auVar121 = ZEXT416((uint)out_shift);
    iStack_454 = local_458;
    iStack_450 = local_458;
    iStack_44c = local_458;
    iStack_444 = local_448;
    iStack_440 = local_448;
    iStack_43c = local_448;
    do {
      if (out_shift != 0) {
        iVar78 = *(int *)((long)*out + 4);
        lVar69 = (*out)[1];
        iVar79 = *(int *)((long)*out + 0xc);
        lVar70 = out[1][0];
        iVar91 = *(int *)((long)out[1] + 4);
        lVar71 = out[1][1];
        iVar84 = *(int *)((long)out[1] + 0xc);
        lVar72 = out[2][0];
        iVar85 = *(int *)((long)out[2] + 4);
        lVar73 = out[2][1];
        iVar86 = *(int *)((long)out[2] + 0xc);
        lVar74 = out[3][0];
        iVar83 = *(int *)((long)out[3] + 4);
        lVar75 = out[3][1];
        iVar131 = *(int *)((long)out[3] + 0xc);
        *(int *)*out = (int)(*out)[0] + iVar80 >> auVar121;
        *(int *)((long)*out + 4) = iVar78 + iVar80 >> auVar121;
        *(int *)(*out + 1) = (int)lVar69 + iVar80 >> auVar121;
        *(int *)((long)*out + 0xc) = iVar79 + iVar80 >> auVar121;
        *(int *)out[1] = (int)lVar70 + iVar80 >> auVar121;
        *(int *)((long)out[1] + 4) = iVar91 + iVar80 >> auVar121;
        *(int *)(out[1] + 1) = (int)lVar71 + iVar80 >> auVar121;
        *(int *)((long)out[1] + 0xc) = iVar84 + iVar80 >> auVar121;
        *(int *)out[2] = (int)lVar72 + iVar80 >> auVar121;
        *(int *)((long)out[2] + 4) = iVar85 + iVar80 >> auVar121;
        *(int *)(out[2] + 1) = (int)lVar73 + iVar80 >> auVar121;
        *(int *)((long)out[2] + 0xc) = iVar86 + iVar80 >> auVar121;
        *(int *)out[3] = (int)lVar74 + iVar80 >> auVar121;
        *(int *)((long)out[3] + 4) = iVar83 + iVar80 >> auVar121;
        *(int *)(out[3] + 1) = (int)lVar75 + iVar80 >> auVar121;
        *(int *)((long)out[3] + 0xc) = iVar131 + iVar80 >> auVar121;
      }
      highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_448,(__m128i *)&local_458,4);
      uVar81 = uVar81 + 4;
      out = out + 4;
    } while (uVar81 < 0x3c);
  }
  return;
}

Assistant:

static void idct64x64_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);

  {
    __m128i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m128i temp1, temp2;
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}